

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O1

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  size_type sVar1;
  int iVar2;
  cmake *pcVar3;
  cmTarget *this_00;
  mapped_type *pmVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  pointer ppcVar8;
  char *pcVar9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  string valueNew;
  string ltValue;
  string lib;
  string valueOld;
  string targetEntry;
  string ltVar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  cmGeneratedFileStream *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined1 *local_190;
  char *local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  string local_170;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  cmGlobalGenerator *local_130;
  key_type local_128;
  string local_108;
  key_type local_e8;
  pointer local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  if (this->Append == true) {
    local_1b8 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(local_1b8,(this->Filename)._M_dataplus._M_p,_S_app);
  }
  else {
    local_1b8 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream
              (local_1b8,(this->Filename)._M_dataplus._M_p,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(local_1b8,true);
  }
  if (((&(local_1b8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(local_1b8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar3 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    local_130 = pcVar3->GlobalGenerator;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c0._M_impl.super__Rb_tree_header._M_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar8 = (local_130->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar8 !=
        (local_130->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_c8 = ppcVar8;
        for (p_Var11 = ((*ppcVar8)->Targets)._M_h._M_before_begin._M_nxt;
            p_Var11 != (_Hash_node_base *)0x0; p_Var11 = p_Var11->_M_nxt) {
          if (0xfffffffc < *(int *)&p_Var11[0x47]._M_nxt - 4U) {
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,p_Var11[0x27]._M_nxt,
                       (long)&(p_Var11[0x27]._M_nxt)->_M_nxt + (long)&(p_Var11[0x28]._M_nxt)->_M_nxt
                      );
            std::__cxx11::string::append((char *)&local_128);
            local_150 = &local_140;
            local_148 = 0;
            local_140 = 0;
            local_1b0 = &local_1a0;
            local_1a8 = 0;
            local_1a0 = 0;
            for (p_Var10 = p_Var11[0x42]._M_nxt; p_Var10 != p_Var11[0x43]._M_nxt;
                p_Var10 = p_Var10 + 5) {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,p_Var10->_M_nxt,
                         (long)&p_Var10->_M_nxt->_M_nxt + (long)&(p_Var10[1]._M_nxt)->_M_nxt);
              std::__cxx11::string::append((char *)&local_e8);
              local_190 = &local_180;
              local_188 = (char *)0x0;
              local_180 = 0;
              iVar2 = *(int *)&p_Var10[4]._M_nxt;
              if (iVar2 == 0) {
                std::__cxx11::string::append((char *)&local_1b0);
                pcVar9 = "general";
LAB_002f18fb:
                std::__cxx11::string::_M_replace((ulong)&local_190,0,local_188,(ulong)pcVar9);
              }
              else {
                if (iVar2 == 1) {
                  std::__cxx11::string::append((char *)&local_1b0);
                  pcVar9 = "debug";
                  goto LAB_002f18fb;
                }
                if (iVar2 == 2) {
                  std::__cxx11::string::append((char *)&local_1b0);
                  pcVar9 = "optimized";
                  goto LAB_002f18fb;
                }
              }
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_170,p_Var10->_M_nxt,
                         (long)&p_Var10->_M_nxt->_M_nxt + (long)&(p_Var10[1]._M_nxt)->_M_nxt);
              this_00 = cmGlobalGenerator::FindTarget(local_130,&local_170,false);
              if (this_00 != (cmTarget *)0x0) {
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,"OUTPUT_NAME","");
                pcVar9 = cmTarget::GetProperty(this_00,&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                sVar1 = local_170._M_string_length;
                if (pcVar9 != (char *)0x0) {
                  strlen(pcVar9);
                  std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)sVar1,(ulong)pcVar9);
                }
              }
              std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_150);
              std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_170._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_1b0);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_c0,&local_e8);
              pcVar9 = (char *)pmVar4->_M_string_length;
              if (pcVar9 == (char *)0x0) {
                std::__cxx11::string::_M_assign((string *)pmVar4);
              }
              else if ((pcVar9 != local_188) ||
                      (iVar2 = bcmp((pmVar4->_M_dataplus)._M_p,local_190,(size_t)pcVar9), iVar2 != 0
                      )) {
                std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar9,0x56b977);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_190 != &local_180) {
                operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_90,&local_128);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_60,&local_128);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
            }
            if (local_150 != &local_140) {
              operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        ppcVar8 = local_c8 + 1;
      } while (ppcVar8 !=
               (local_130->Makefiles).
               super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"# Generated by CMake\n\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"if(",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"  # Information for CMake 2.6 and above.\n",0x29);
    p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_90._M_impl.super__Rb_tree_header) {
      do {
        if (p_Var6[2]._M_parent != (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"  set(\"",7);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" \"",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"else()\n",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"  # Information for CMake 2.4 and lower.\n",0x29);
    p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_c0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6,
          (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header) {
      if (p_Var7[2]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"  set(\"",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" \"",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)(p_Var7 + 2),(long)p_Var7[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    if ((_Rb_tree_header *)p_Var6 != &local_c0._M_impl.super__Rb_tree_header) {
      do {
        iVar2 = std::__cxx11::string::compare((char *)(p_Var6 + 2));
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"  set(\"",7);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" \"",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_c0._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"endif()\n",8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    cmSystemTools::Error("Error Writing ",(this->Filename)._M_dataplus._M_p,(char *)0x0,(char *)0x0)
    ;
    cmSystemTools::ReportLastSystemError("");
  }
  (*(local_1b8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream[1])();
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  CM_AUTO_PTR<cmsys::ofstream> foutPtr;
  if (this->Append) {
    CM_AUTO_PTR<cmsys::ofstream> ap(
      new cmsys::ofstream(this->Filename.c_str(), std::ios::app));
    foutPtr = ap;
  } else {
    CM_AUTO_PTR<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing ", this->Filename.c_str());
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmMakefile*>& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (std::vector<cmMakefile*>::const_iterator i = locals.begin();
       i != locals.end(); ++i) {
    const cmTargets& tgts = (*i)->GetTargets();
    for (cmTargets::const_iterator l = tgts.begin(); l != tgts.end(); ++l) {
      // Get the current target.
      cmTarget const& target = l->second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LinkLibraryVectorType::const_iterator li = libs.begin();
           li != libs.end(); ++li) {
        std::string ltVar = li->first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch (li->second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li->first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (const char* outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (std::map<std::string, std::string>::const_iterator i =
         libDepsNew.begin();
       i != libDepsNew.end(); ++i) {
    if (!i->second.empty()) {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (std::map<std::string, std::string>::const_iterator i =
         libDepsOld.begin();
       i != libDepsOld.end(); ++i) {
    if (!i->second.empty()) {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  for (std::map<std::string, std::string>::const_iterator i = libTypes.begin();
       i != libTypes.end(); ++i) {
    if (i->second != "general") {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  fout << "endif()\n";
}